

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::rebucket(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
           *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
          bool count_unfinished)

{
  value_type vVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  unsigned_long uVar7;
  reference pvVar8;
  reference __y;
  ulong uVar9;
  reference puVar10;
  bool bVar11;
  value_type local_150;
  value_type local_140;
  bool local_121;
  ulong local_e8;
  size_t i_2;
  unsigned_long local_d8;
  size_t pre_max;
  pointer local_c8;
  size_t local_max;
  reverse_iterator rev_it;
  pair<unsigned_long,_unsigned_long> local_b0;
  undefined1 local_a0 [8];
  pair<unsigned_long,_unsigned_long> local_result;
  size_t i_1;
  unsigned_long local_unfinished_els;
  unsigned_long local_unfinished_buckets;
  unsigned_long prev_right;
  size_type sStack_68;
  bool setOne;
  size_t i;
  undefined1 auStack_58 [6];
  bool nextDiff;
  bool firstDiff;
  pair<unsigned_long,_unsigned_long> prevRight;
  pair<unsigned_long,_unsigned_long> last_element;
  size_t prefix;
  bool count_unfinished_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_B2_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *this_local;
  pair<unsigned_long,_unsigned_long> result;
  
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B);
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(param_1);
  bVar11 = false;
  if (sVar5 == sVar6) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B);
    bVar11 = sVar5 != 0;
  }
  if (!bVar11) {
    __assert_fail("local_B.size() == local_B2.size() && local_B.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x3ed,
                  "std::pair<size_t, size_t> suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket(std::vector<index_t> &, bool) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                 );
  }
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)&this_local);
  uVar7 = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size(&this->part)
  ;
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->local_B);
  __y = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(param_1);
  join_0x00000010_0x00000000_ = std::make_pair<unsigned_long&,unsigned_long&>(pvVar8,__y);
  _auStack_58 = mxx::right_shift<std::pair<unsigned_long,unsigned_long>>
                          ((pair<unsigned_long,_unsigned_long> *)&prevRight.second,&this->comm);
  i._7_1_ = 0;
  iVar4 = mxx::comm::rank(&this->comm);
  if (iVar4 == 0) {
    i._7_1_ = 1;
  }
  else {
    vVar1 = _auStack_58;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,0);
    if (vVar1 == *pvVar8) {
      uVar2 = prevRight.first;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_1,0);
      if (uVar2 == *pvVar8) goto LAB_00189bd5;
    }
    i._7_1_ = 1;
  }
LAB_00189bd5:
  i._6_1_ = i._7_1_ & 1;
  for (sStack_68 = 0; uVar9 = sStack_68 + 1,
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B),
      uVar9 < sVar5; sStack_68 = sStack_68 + 1) {
    prev_right._7_1_ = i._6_1_ & 1;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,sStack_68);
    vVar1 = *pvVar8;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,sStack_68 + 1);
    local_121 = true;
    if (vVar1 == *pvVar8) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (param_1,sStack_68);
      vVar1 = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (param_1,sStack_68 + 1);
      local_121 = vVar1 != *pvVar8;
    }
    i._6_1_ = local_121;
    if ((prev_right._7_1_ & 1) == 0) {
      local_140 = 0;
    }
    else {
      local_140 = uVar7 + sStack_68 + 1;
    }
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,sStack_68);
    *pvVar8 = local_140;
  }
  if ((i._6_1_ & 1) == 0) {
    local_150 = 0;
  }
  else {
    local_150 = uVar7 + this->local_size;
  }
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->local_B);
  *pvVar8 = local_150;
  if (count_unfinished) {
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->local_B);
    local_unfinished_buckets = mxx::right_shift<unsigned_long>(pvVar8,&this->comm);
    local_unfinished_els = 0;
    i_1 = 0;
    iVar4 = mxx::comm::rank(&this->comm);
    if (iVar4 != 0) {
      bVar11 = false;
      if (local_unfinished_buckets != 0) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_B,0);
        bVar11 = *pvVar8 == 0;
      }
      i_1 = (size_t)(int)(uint)bVar11;
      local_unfinished_els = i_1;
    }
    for (local_result.second = 1; uVar2 = local_result.second,
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B),
        uVar2 < sVar5; local_result.second = local_result.second + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,local_result.second - 1);
      if ((*pvVar8 != 0) &&
         (pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->local_B,local_result.second), *pvVar8 == 0)) {
        local_unfinished_els = local_unfinished_els + 1;
        i_1 = i_1 + 1;
      }
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,local_result.second);
      if (*pvVar8 == 0) {
        i_1 = i_1 + 1;
      }
    }
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)local_a0,&local_unfinished_els,&i_1);
    local_b0 = mxx::
               allreduce<std::pair<unsigned_long,unsigned_long>,pair_sum<unsigned_long,unsigned_long>>
                         (local_a0,&this->comm);
    std::pair<unsigned_long,_unsigned_long>::operator=
              ((pair<unsigned_long,_unsigned_long> *)&this_local,&local_b0);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rbegin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_max);
  local_c8 = (pointer)0x0;
  while( true ) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rend
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pre_max);
    bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)&local_max,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)&pre_max);
    bVar11 = false;
    if (bVar3) {
      puVar10 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)&local_max);
      local_c8 = (pointer)*puVar10;
      bVar11 = local_c8 == (pointer)0x0;
    }
    if (!bVar11) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&local_max);
  }
  local_d8 = mxx::exscan<unsigned_long,mxx::max<unsigned_long>>(&local_c8,&this->comm);
  iVar4 = mxx::comm::rank(&this->comm);
  if (iVar4 == 0) {
    local_d8 = 0;
  }
  local_e8 = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B);
    if (sVar5 <= local_e8) {
      return _this_local;
    }
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,local_e8);
    if (*pvVar8 == 0) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,local_e8);
      *pvVar8 = local_d8;
    }
    else {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,local_e8);
      local_d8 = *pvVar8;
    }
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,local_e8);
    if (local_e8 + uVar7 + 1 < *pvVar8) break;
    bVar11 = true;
    if (local_e8 != 0) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,local_e8 - 1);
      vVar1 = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,local_e8);
      bVar11 = true;
      if (vVar1 != *pvVar8) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->local_B,local_e8);
        bVar11 = *pvVar8 == local_e8 + uVar7 + 1;
      }
    }
    if (!bVar11) {
      __assert_fail("i == 0 || (local_B[i-1] == local_B[i] || local_B[i] == i+prefix+1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                    ,0x441,
                    "std::pair<size_t, size_t> suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket(std::vector<index_t> &, bool) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                   );
    }
    local_e8 = local_e8 + 1;
  }
  __assert_fail("local_B[i] <= i+prefix+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                ,0x43f,
                "std::pair<size_t, size_t> suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket(std::vector<index_t> &, bool) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
               );
}

Assistant:

std::pair<size_t,size_t> rebucket(std::vector<index_t>& local_B2, bool count_unfinished) {
    /*
     * NOTE: buckets are indexed by the global index of the first element in
     *       the bucket with a ONE-BASED-INDEX (since bucket number `0` is
     *       reserved for out-of-bounds)
     */
    // assert inputs are of equal size
    assert(local_B.size() == local_B2.size() && local_B.size() > 0);

    // init result
    std::pair<size_t,size_t> result;

    // get my global starting index
    size_t prefix = part.excl_prefix_size();

    /*
     * assign local zero or one, depending on whether the bucket is the same
     * as the previous one
     */

    std::pair<index_t, index_t> last_element = std::make_pair(local_B.back(), local_B2.back());
    std::pair<index_t, index_t> prevRight = mxx::right_shift(last_element, comm);
    bool firstDiff = false;
    if (comm.rank() == 0) {
        firstDiff = true;
    } else if (prevRight.first != local_B[0] || prevRight.second != local_B2[0]) {
        firstDiff = true;
    }

    // set local_B1 to `1` if previous entry is different:
    // i.e., mark start of buckets
    bool nextDiff = firstDiff;
    for (std::size_t i = 0; i+1 < local_B.size(); ++i) {
        bool setOne = nextDiff;
        nextDiff = (local_B[i] != local_B[i+1] || local_B2[i] != local_B2[i+1]);
        local_B[i] = setOne ? prefix+i+1 : 0;
    }

    local_B.back() = nextDiff ? prefix+(local_size-1)+1 : 0;

    if (count_unfinished) {
        // count the number of unfinished elements and buckets
        index_t prev_right = mxx::right_shift(local_B.back(), comm);
        index_t local_unfinished_buckets = 0;
        index_t local_unfinished_els = 0;
        if (comm.rank() != 0) {
            local_unfinished_buckets = (prev_right > 0 && local_B[0] == 0) ? 1 : 0;
            local_unfinished_els = local_unfinished_buckets;
        }
        for (size_t i = 1; i < local_B.size(); ++i) {
            if(local_B[i-1] > 0 && local_B[i] == 0) {
                ++local_unfinished_buckets;
                ++local_unfinished_els;
            }
            if (local_B[i] == 0) {
                ++local_unfinished_els;
            }
        }
        std::pair<size_t,size_t> local_result(local_unfinished_buckets, local_unfinished_els);
        result = mxx::allreduce(local_result, pair_sum<size_t,size_t>(), comm);
    }


    /*
     * Global prefix MAX:
     *  - such that for every item we have it's bucket number, where the
     *    bucket number is equal to the first index in the bucket
     *    this way buckets who are finished, will never receive a new
     *    number.
     */
    // 1.) find the max in the local sequence. since the max is the last index
    //     of a bucket, this should be somewhere at the end -> start scanning
    //     from the end
    auto rev_it = local_B.rbegin();
    size_t local_max = 0;
    while (rev_it != local_B.rend() && (local_max = *rev_it) == 0)
        ++rev_it;

    // 2.) distributed scan with max() to get starting max for each sequence
    size_t pre_max = mxx::exscan(local_max, mxx::max<size_t>(), comm);
    if (comm.rank() == 0)
        pre_max = 0;

    // 3.) linear scan and assign bucket numbers
    for (size_t i = 0; i < local_B.size(); ++i) {
        if (local_B[i] == 0)
            local_B[i] = pre_max;
        else
            pre_max = local_B[i];
        assert(local_B[i] <= i+prefix+1);
        // first element of bucket has id of it's own global index:
        assert(i == 0 || (local_B[i-1] ==  local_B[i] || local_B[i] == i+prefix+1));
    }

    return result;
}